

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O3

void inflate_fast(z_streamp strm,uint start)

{
  byte *pbVar1;
  byte *pbVar2;
  Bytef *pBVar3;
  internal_state iVar4;
  internal_state iVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  internal_state *piVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  undefined4 uVar17;
  long lVar18;
  Bytef *pBVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  Bytef *pBVar25;
  ushort uVar26;
  uint uVar27;
  Bytef *pBVar28;
  uint uVar29;
  Bytef *pBVar30;
  int local_40;
  
  piVar11 = strm->state;
  pBVar28 = strm->next_in + ((ulong)(strm->avail_in - 5) - 1);
  pBVar19 = strm->next_in + -1;
  pBVar25 = strm->next_out + -1;
  local_40 = (int)pBVar25 - (start - strm->avail_out);
  pBVar30 = strm->next_out + ((ulong)(strm->avail_out - 0x101) - 1);
  iVar8 = *(int *)(piVar11 + 0x34);
  uVar9 = *(uint *)(piVar11 + 0x38);
  uVar10 = *(uint *)(piVar11 + 0x3c);
  lVar20 = *(long *)(piVar11 + 0x40);
  uVar23 = *(ulong *)(piVar11 + 0x48);
  uVar14 = *(uint *)(piVar11 + 0x50);
  iVar4 = piVar11[0x70];
  iVar5 = piVar11[0x74];
  lVar12 = *(long *)(piVar11 + 0x60);
  lVar13 = *(long *)(piVar11 + 0x68);
LAB_0011a933:
  if (uVar14 < 0xf) {
    pbVar1 = pBVar19 + 1;
    pbVar2 = pBVar19 + 2;
    pBVar19 = pBVar19 + 2;
    uVar23 = ((ulong)*pbVar2 << ((byte)uVar14 + 8 & 0x3f)) +
             ((ulong)*pbVar1 << ((byte)uVar14 & 0x3f)) + uVar23;
    uVar14 = uVar14 | 0x10;
  }
  uVar22 = (ulong)((uint)uVar23 & ~(-1 << ((byte)iVar4 & 0x1f)));
  while( true ) {
    bVar6 = *(byte *)(lVar12 + 1 + uVar22 * 4);
    uVar23 = uVar23 >> (bVar6 & 0x3f);
    bVar7 = *(byte *)(lVar12 + uVar22 * 4);
    uVar26 = *(ushort *)(lVar12 + 2 + uVar22 * 4);
    uVar14 = uVar14 - bVar6;
    if (bVar7 == 0) break;
    if ((bVar7 & 0x10) != 0) {
      uVar29 = (uint)uVar26;
      uVar16 = bVar7 & 0xf;
      if ((bVar7 & 0xf) != 0) {
        if (uVar14 < uVar16) {
          pbVar1 = pBVar19 + 1;
          pBVar19 = pBVar19 + 1;
          uVar23 = uVar23 + ((ulong)*pbVar1 << ((byte)uVar14 & 0x3f));
          uVar14 = uVar14 + 8;
        }
        uVar29 = (uint)uVar26 + (~(-1 << (sbyte)uVar16) & (uint)uVar23);
        uVar23 = uVar23 >> (sbyte)uVar16;
        uVar14 = uVar14 - uVar16;
      }
      if (uVar14 < 0xf) {
        pbVar1 = pBVar19 + 1;
        pbVar2 = pBVar19 + 2;
        pBVar19 = pBVar19 + 2;
        uVar23 = ((ulong)*pbVar2 << ((byte)uVar14 + 8 & 0x3f)) +
                 ((ulong)*pbVar1 << ((byte)uVar14 & 0x3f)) + uVar23;
        uVar14 = uVar14 | 0x10;
      }
      uVar22 = (ulong)((uint)uVar23 & ~(-1 << ((byte)iVar5 & 0x1f)));
      bVar7 = *(byte *)(lVar13 + uVar22 * 4);
      bVar6 = *(byte *)(lVar13 + 1 + uVar22 * 4);
      uVar26 = *(ushort *)(lVar13 + 2 + uVar22 * 4);
      uVar23 = uVar23 >> (bVar6 & 0x3f);
      uVar14 = uVar14 - bVar6;
      goto LAB_0011aa37;
    }
    if ((bVar7 & 0x40) != 0) {
      uVar17 = 0xb;
      if ((bVar7 & 0x20) != 0) goto LAB_0011ad17;
      pcVar15 = "invalid literal/length code";
      goto LAB_0011ad0e;
    }
    uVar22 = (ulong)(~(-1 << (bVar7 & 0x1f)) & (uint)uVar23) + (ulong)uVar26;
  }
  pBVar25[1] = (Bytef)uVar26;
  pBVar25 = pBVar25 + 1;
  goto LAB_0011acc8;
LAB_0011aa37:
  if ((bVar7 & 0x10) != 0) goto LAB_0011aa75;
  if ((bVar7 & 0x40) != 0) {
    pcVar15 = "invalid distance code";
    goto LAB_0011ad0e;
  }
  lVar24 = (ulong)(~(-1 << (bVar7 & 0x1f)) & (uint)uVar23) + (ulong)uVar26;
  bVar6 = *(byte *)(lVar13 + 1 + lVar24 * 4);
  uVar23 = uVar23 >> (bVar6 & 0x3f);
  bVar7 = *(byte *)(lVar13 + lVar24 * 4);
  uVar26 = *(ushort *)(lVar13 + 2 + lVar24 * 4);
  uVar14 = uVar14 - bVar6;
  goto LAB_0011aa37;
LAB_0011aa75:
  uVar16 = bVar7 & 0xf;
  if (uVar14 < uVar16) {
    uVar23 = ((ulong)pBVar19[1] << ((byte)uVar14 & 0x3f)) + uVar23;
    uVar21 = uVar14 + 8;
    if (uVar21 < uVar16) {
      pbVar1 = pBVar19 + 2;
      pBVar19 = pBVar19 + 2;
      uVar23 = uVar23 + ((ulong)*pbVar1 << ((byte)uVar21 & 0x3f));
      uVar14 = uVar14 + 0x10;
    }
    else {
      pBVar19 = pBVar19 + 1;
      uVar14 = uVar21;
    }
  }
  uVar21 = (~(-1 << (sbyte)uVar16) & (uint)uVar23) + (uint)uVar26;
  uVar23 = uVar23 >> (sbyte)uVar16;
  uVar14 = uVar14 - uVar16;
  uVar16 = (int)pBVar25 - local_40;
  uVar27 = uVar21 - uVar16;
  if (uVar21 < uVar16 || uVar27 == 0) {
    uVar22 = (ulong)uVar21;
    lVar24 = 0;
    uVar16 = uVar29;
    do {
      lVar18 = lVar24;
      pBVar25[lVar18 + 1] = pBVar25[lVar18 + (1 - uVar22)];
      pBVar25[lVar18 + 2] = pBVar25[lVar18 + (2 - uVar22)];
      pBVar25[lVar18 + 3] = pBVar25[lVar18 + (3 - uVar22)];
      uVar16 = uVar16 - 3;
      lVar24 = lVar18 + 3;
    } while (2 < uVar16);
    if ((uint)lVar24 == uVar29) {
      pBVar25 = pBVar25 + lVar24;
    }
    else {
      pBVar25[lVar18 + 4] = pBVar25[-uVar22 + 1 + lVar24];
      if ((uint)lVar24 - uVar29 == -2) {
        pBVar3 = pBVar25 + -uVar22 + 2 + lVar24;
        pBVar25 = pBVar25 + lVar18 + 5;
        *pBVar25 = *pBVar3;
      }
      else {
        pBVar25 = pBVar25 + lVar18 + 4;
      }
    }
    goto LAB_0011acc8;
  }
  if ((uVar9 < uVar27) && (*(int *)(piVar11 + 0x1be0) != 0)) {
    pcVar15 = "invalid distance too far back";
LAB_0011ad0e:
    strm->msg = pcVar15;
    uVar17 = 0x1d;
LAB_0011ad17:
    *(undefined4 *)piVar11 = uVar17;
LAB_0011ad1a:
    lVar20 = (long)pBVar19 - (ulong)(uVar14 >> 3);
    strm->next_in = (Bytef *)(lVar20 + 1);
    strm->next_out = pBVar25 + 1;
    strm->avail_in = ((int)pBVar28 - (int)lVar20) + 5;
    strm->avail_out = ((int)pBVar30 - (int)pBVar25) + 0x101;
    *(ulong *)(piVar11 + 0x48) = (ulong)((uint)uVar23 & ~(-1 << (sbyte)(uVar14 & 7)));
    *(uint *)(piVar11 + 0x50) = uVar14 & 7;
    return;
  }
  if (uVar10 == 0) {
    uVar22 = (ulong)(iVar8 - uVar27);
    uVar16 = uVar29 - uVar27;
    if (uVar29 < uVar27 || uVar16 == 0) goto LAB_0011ac55;
    lVar24 = 0;
    do {
      pBVar25[1] = *(Bytef *)(uVar22 + lVar20 + lVar24);
      pBVar25 = pBVar25 + 1;
      lVar24 = lVar24 + 1;
    } while (uVar27 != (uint)lVar24);
LAB_0011ac48:
    lVar24 = (long)pBVar25 - (ulong)uVar21;
  }
  else {
    if (uVar10 < uVar27) {
      uVar22 = (ulong)((uVar10 + iVar8) - uVar27);
      uVar27 = uVar27 - uVar10;
      uVar16 = uVar29 - uVar27;
      if (uVar27 <= uVar29 && uVar16 != 0) {
        lVar24 = 0;
        do {
          pBVar25[lVar24 + 1] = *(Bytef *)(uVar22 + lVar20 + lVar24);
          lVar24 = lVar24 + 1;
        } while (uVar27 != (uint)lVar24);
        pBVar25 = pBVar25 + lVar24;
        lVar24 = lVar20 + -1;
        if (uVar10 < uVar16) {
          lVar24 = 0;
          do {
            pBVar25[1] = *(Bytef *)(lVar20 + lVar24);
            pBVar25 = pBVar25 + 1;
            lVar24 = lVar24 + 1;
          } while (uVar10 != (uint)lVar24);
          uVar16 = uVar16 - uVar10;
          goto LAB_0011ac48;
        }
        goto joined_r0x0011ac5e;
      }
    }
    else {
      uVar22 = (ulong)(uVar10 - uVar27);
      uVar16 = uVar29 - uVar27;
      if (uVar27 <= uVar29 && uVar16 != 0) {
        lVar24 = 0;
        do {
          pBVar25[1] = *(Bytef *)(uVar22 + lVar20 + lVar24);
          pBVar25 = pBVar25 + 1;
          lVar24 = lVar24 + 1;
        } while (uVar27 != (uint)lVar24);
        goto LAB_0011ac48;
      }
    }
LAB_0011ac55:
    lVar24 = uVar22 + lVar20 + -1;
    uVar16 = uVar29;
  }
joined_r0x0011ac5e:
  for (; 2 < uVar16; uVar16 = uVar16 - 3) {
    pBVar25[1] = *(Bytef *)(lVar24 + 1);
    pBVar25[2] = *(Bytef *)(lVar24 + 2);
    pBVar25[3] = *(Bytef *)(lVar24 + 3);
    pBVar25 = pBVar25 + 3;
    lVar24 = lVar24 + 3;
  }
  if (uVar16 != 0) {
    pBVar25[1] = *(Bytef *)(lVar24 + 1);
    if (uVar16 == 2) {
      pBVar25[2] = *(Bytef *)(lVar24 + 2);
      pBVar25 = pBVar25 + 2;
    }
    else {
      pBVar25 = pBVar25 + 1;
    }
  }
LAB_0011acc8:
  if ((pBVar28 <= pBVar19) || (pBVar30 <= pBVar25)) goto LAB_0011ad1a;
  goto LAB_0011a933;
}

Assistant:

void ZLIB_INTERNAL inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    unsigned char FAR *in;      /* local strm->next_in */
    unsigned char FAR *last;    /* while in < last, enough input available */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned wnext;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code here;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in - OFF;
    last = in + (strm->avail_in - 5);
    out = strm->next_out - OFF;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    wnext = state->wnext;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
        }
        here = lcode[hold & lmask];
      dolen:
        op = (unsigned)(here.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(here.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, here.val >= 0x20 && here.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", here.val));
            PUP(out) = (unsigned char)(here.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(here.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
            }
            here = dcode[hold & dmask];
          dodist:
            op = (unsigned)(here.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(here.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(here.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(PUP(in)) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        if (state->sane) {
                            strm->msg =
                                (char *)"invalid distance too far back";
                            state->mode = BAD;
                            break;
                        }
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        if (len <= op - whave) {
                            do {
                                PUP(out) = 0;
                            } while (--len);
                            continue;
                        }
                        len -= op - whave;
                        do {
                            PUP(out) = 0;
                        } while (--op > whave);
                        if (op == 0) {
                            from = out - dist;
                            do {
                                PUP(out) = PUP(from);
                            } while (--len);
                            continue;
                        }
#endif
                    }
                    from = window - OFF;
                    if (wnext == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (wnext < op) {      /* wrap around window */
                        from += wsize + wnext - op;
                        op -= wnext;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = window - OFF;
                            if (wnext < len) {  /* some from start of window */
                                op = wnext;
                                len -= op;
                                do {
                                    PUP(out) = PUP(from);
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += wnext - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    }
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                here = dcode[here.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            here = lcode[here.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in + OFF;
    strm->next_out = out + OFF;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}